

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vector<unsigned_int>_>::resize
          (vector<crnlib::vector<unsigned_int>_> *this,uint new_size,bool grow_hint)

{
  undefined1 in_DL;
  uint in_ESI;
  long in_RDI;
  bool in_stack_ffffffffffffffda;
  bool in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined3 uVar1;
  uint in_stack_ffffffffffffffe4;
  
  if (*(uint *)(in_RDI + 8) != in_ESI) {
    if (in_ESI < *(uint *)(in_RDI + 8)) {
      scalar_type<crnlib::vector<unsigned_int>_>::destruct_array
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    }
    else {
      if (*(uint *)(in_RDI + 0xc) < in_ESI) {
        uVar1 = (undefined3)in_stack_ffffffffffffffe4;
        in_stack_ffffffffffffffe4 = CONCAT13(1,uVar1);
        if (in_ESI != *(int *)(in_RDI + 8) + 1U) {
          in_stack_ffffffffffffffe4 = CONCAT13(in_DL,uVar1) & 0x1ffffff;
        }
        in_stack_ffffffffffffffe0 = in_ESI;
        increase_capacity((vector<crnlib::vector<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_ESI),in_stack_ffffffffffffffdc,
                          in_stack_ffffffffffffffdb,in_stack_ffffffffffffffda);
      }
      scalar_type<crnlib::vector<unsigned_int>_>::construct_array
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    }
    *(uint *)(in_RDI + 8) = in_ESI;
  }
  return;
}

Assistant:

inline void resize(uint new_size, bool grow_hint = false) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity)
          increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }
  }